

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall QGraphicsScenePrivate::enableMouseTrackingOnViews(QGraphicsScenePrivate *this)

{
  long lVar1;
  QGraphicsView **ppQVar2;
  QWidget *this_00;
  long lVar3;
  
  lVar1 = (this->views).d.size;
  if (lVar1 != 0) {
    ppQVar2 = (this->views).d.ptr;
    lVar3 = 0;
    do {
      this_00 = QAbstractScrollArea::viewport(*(QAbstractScrollArea **)((long)ppQVar2 + lVar3));
      QWidget::setAttribute(this_00,WA_MouseTracking,true);
      lVar3 = lVar3 + 8;
    } while (lVar1 << 3 != lVar3);
  }
  return;
}

Assistant:

const T *constEnd() const noexcept { return data() + size; }